

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcp.c
# Opt level: O1

int tcptran_ep_get_recvmaxsz(void *arg,void *v,size_t *szp,nni_opt_type t)

{
  int iVar1;
  
  nni_mtx_lock((nni_mtx *)arg);
  iVar1 = nni_copyout_size(*(size_t *)((long)arg + 0x30),v,szp,t);
  nni_mtx_unlock((nni_mtx *)arg);
  return iVar1;
}

Assistant:

static int
tcptran_ep_get_recvmaxsz(void *arg, void *v, size_t *szp, nni_opt_type t)
{
	tcptran_ep *ep = arg;
	int         rv;

	nni_mtx_lock(&ep->mtx);
	rv = nni_copyout_size(ep->rcvmax, v, szp, t);
	nni_mtx_unlock(&ep->mtx);
	return (rv);
}